

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext.cc
# Opt level: O0

void __thiscall fasttext::FastText::quantize(FastText *this,Args *qargs)

{
  byte bVar1;
  ulong uVar2;
  element_type *peVar3;
  invalid_argument *this_00;
  string *psVar4;
  ulong uVar5;
  size_type sVar6;
  long in_RSI;
  long in_RDI;
  vector<int,_std::allocator<int>_> *in_stack_00000008;
  Dictionary *in_stack_00000010;
  shared_ptr<fasttext::Loss> loss;
  shared_ptr<fasttext::Loss> loss_1;
  int j;
  int i;
  shared_ptr<fasttext::DenseMatrix> ninput;
  vector<int,_std::allocator<int>_> idx;
  bool normalizeGradient;
  shared_ptr<fasttext::DenseMatrix> output;
  shared_ptr<fasttext::DenseMatrix> input;
  shared_ptr<fasttext::DenseMatrix> *in_stack_fffffffffffffe88;
  DenseMatrix *in_stack_fffffffffffffe90;
  undefined4 in_stack_fffffffffffffe98;
  undefined4 in_stack_fffffffffffffe9c;
  int iVar7;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffea0;
  undefined4 in_stack_fffffffffffffea8;
  undefined4 in_stack_fffffffffffffeac;
  int in_stack_fffffffffffffeb0;
  real in_stack_fffffffffffffeb4;
  shared_ptr<fasttext::Loss> *in_stack_fffffffffffffeb8;
  element_type *in_stack_fffffffffffffec0;
  DenseMatrix *in_stack_fffffffffffffec8;
  FastText *in_stack_ffffffffffffff60;
  FastText *in_stack_ffffffffffffff68;
  int32_t in_stack_ffffffffffffff74;
  FastText *in_stack_ffffffffffffff78;
  int local_80;
  int local_7c;
  vector<int,_std::allocator<int>_> local_60;
  undefined1 local_41;
  __shared_ptr<fasttext::DenseMatrix,_(__gnu_cxx::_Lock_policy)2> local_40;
  __shared_ptr<fasttext::DenseMatrix,_(__gnu_cxx::_Lock_policy)2> local_30 [2];
  long local_10;
  
  local_10 = in_RSI;
  peVar3 = std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x1abd9c);
  if (peVar3->model != sup) {
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument
              (this_00,"For now we only support quantization of supervised models");
    __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  psVar4 = (string *)(local_10 + 0x38);
  peVar3 = std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x1abe2a);
  std::__cxx11::string::operator=((string *)&peVar3->input,psVar4);
  bVar1 = *(byte *)(local_10 + 0x110);
  peVar3 = std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x1abe5a);
  peVar3->qout = (bool)(bVar1 & 1);
  psVar4 = (string *)(local_10 + 0x58);
  peVar3 = std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x1abe85);
  std::__cxx11::string::operator=((string *)&peVar3->output,psVar4);
  std::dynamic_pointer_cast<fasttext::DenseMatrix,fasttext::Matrix>
            ((shared_ptr<fasttext::Matrix> *)
             CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
  std::dynamic_pointer_cast<fasttext::DenseMatrix,fasttext::Matrix>
            ((shared_ptr<fasttext::Matrix> *)
             CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
  peVar3 = std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x1abed5);
  local_41 = peVar3->model == sup;
  if (*(long *)(local_10 + 0x118) != 0) {
    uVar2 = *(ulong *)(local_10 + 0x118);
    std::__shared_ptr_access<fasttext::DenseMatrix,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<fasttext::DenseMatrix,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x1abf1f);
    uVar5 = Matrix::size((Matrix *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
                         (int64_t)in_stack_fffffffffffffe90);
    if (uVar2 < uVar5) {
      selectEmbeddings(in_stack_ffffffffffffff78,in_stack_ffffffffffffff74);
      std::__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x1abf7b);
      Dictionary::prune(in_stack_00000010,in_stack_00000008);
      std::vector<int,_std::allocator<int>_>::size(&local_60);
      std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x1abfaf);
      std::make_shared<fasttext::DenseMatrix,unsigned_long,int&>
                ((unsigned_long *)in_stack_fffffffffffffeb8,
                 (int *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
      local_7c = 0;
      while( true ) {
        sVar6 = std::vector<int,_std::allocator<int>_>::size(&local_60);
        if (sVar6 <= (ulong)(long)local_7c) break;
        local_80 = 0;
        while( true ) {
          peVar3 = std::
                   __shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x1ac029);
          if (peVar3->dim <= local_80) break;
          in_stack_fffffffffffffec0 =
               std::
               __shared_ptr_access<fasttext::DenseMatrix,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<fasttext::DenseMatrix,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x1ac049);
          std::vector<int,_std::allocator<int>_>::operator[](&local_60,(long)local_7c);
          in_stack_fffffffffffffec8 =
               (DenseMatrix *)
               DenseMatrix::at(in_stack_fffffffffffffe90,(int64_t)in_stack_fffffffffffffe88,0x1ac078
                              );
          in_stack_fffffffffffffeb4 =
               *(real *)&(in_stack_fffffffffffffec8->super_Matrix)._vptr_Matrix;
          std::__shared_ptr_access<fasttext::DenseMatrix,_(__gnu_cxx::_Lock_policy)2,_false,_false>
          ::operator->((__shared_ptr_access<fasttext::DenseMatrix,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x1ac09b);
          in_stack_fffffffffffffeb8 =
               (shared_ptr<fasttext::Loss> *)
               DenseMatrix::at(in_stack_fffffffffffffe90,(int64_t)in_stack_fffffffffffffe88,0x1ac0b3
                              );
          *(real *)&(in_stack_fffffffffffffeb8->
                    super___shared_ptr<fasttext::Loss,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
               in_stack_fffffffffffffeb4;
          local_80 = local_80 + 1;
        }
        local_7c = local_7c + 1;
      }
      std::shared_ptr<fasttext::DenseMatrix>::operator=
                ((shared_ptr<fasttext::DenseMatrix> *)in_stack_fffffffffffffe90,
                 in_stack_fffffffffffffe88);
      if ((*(byte *)(local_10 + 0x111) & 1) != 0) {
        iVar7 = *(int *)(local_10 + 0x8c);
        peVar3 = std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x1ac18b);
        peVar3->epoch = iVar7;
        in_stack_fffffffffffffea0 = *(vector<int,_std::allocator<int>_> **)(local_10 + 0x78);
        peVar3 = std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x1ac1b5);
        peVar3->lr = (double)in_stack_fffffffffffffea0;
        iVar7 = *(int *)(local_10 + 0xb4);
        peVar3 = std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x1ac1df);
        peVar3->thread = iVar7;
        in_stack_fffffffffffffeb0 = *(int *)(local_10 + 0xe0);
        peVar3 = std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x1ac208);
        peVar3->verbose = in_stack_fffffffffffffeb0;
        createLoss(in_stack_ffffffffffffff68,
                   (shared_ptr<fasttext::Matrix> *)in_stack_ffffffffffffff60);
        std::
        make_shared<fasttext::Model,std::shared_ptr<fasttext::DenseMatrix>&,std::shared_ptr<fasttext::DenseMatrix>&,std::shared_ptr<fasttext::Loss>&,bool&>
                  ((shared_ptr<fasttext::DenseMatrix> *)in_stack_fffffffffffffec8,
                   (shared_ptr<fasttext::DenseMatrix> *)in_stack_fffffffffffffec0,
                   in_stack_fffffffffffffeb8,
                   (bool *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
        in_stack_fffffffffffffe90 = (DenseMatrix *)&stack0xffffffffffffff60;
        std::shared_ptr<fasttext::Model>::operator=
                  ((shared_ptr<fasttext::Model> *)in_stack_fffffffffffffe90,
                   (shared_ptr<fasttext::Model> *)in_stack_fffffffffffffe88);
        std::shared_ptr<fasttext::Model>::~shared_ptr((shared_ptr<fasttext::Model> *)0x1ac287);
        startThreads(in_stack_ffffffffffffff60);
        std::shared_ptr<fasttext::Loss>::~shared_ptr((shared_ptr<fasttext::Loss> *)0x1ac2a3);
      }
      std::shared_ptr<fasttext::DenseMatrix>::~shared_ptr
                ((shared_ptr<fasttext::DenseMatrix> *)0x1ac2d5);
      std::vector<int,_std::allocator<int>_>::~vector(in_stack_fffffffffffffea0);
    }
  }
  std::__shared_ptr<fasttext::DenseMatrix,_(__gnu_cxx::_Lock_policy)2>::get(local_30);
  std::make_shared<fasttext::QuantMatrix,fasttext::DenseMatrix,unsigned_long_const&,bool_const&>
            (in_stack_fffffffffffffec8,(unsigned_long *)in_stack_fffffffffffffec0,
             (bool *)in_stack_fffffffffffffeb8);
  std::shared_ptr<fasttext::Matrix>::operator=
            ((shared_ptr<fasttext::Matrix> *)in_stack_fffffffffffffe90,
             (shared_ptr<fasttext::QuantMatrix> *)in_stack_fffffffffffffe88);
  std::shared_ptr<fasttext::QuantMatrix>::~shared_ptr((shared_ptr<fasttext::QuantMatrix> *)0x1ac361)
  ;
  peVar3 = std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x1ac36e);
  if ((peVar3->qout & 1U) != 0) {
    std::__shared_ptr<fasttext::DenseMatrix,_(__gnu_cxx::_Lock_policy)2>::get(&local_40);
    std::make_shared<fasttext::QuantMatrix,fasttext::DenseMatrix,int,bool_const&>
              (in_stack_fffffffffffffec8,(int *)in_stack_fffffffffffffec0,
               (bool *)in_stack_fffffffffffffeb8);
    std::shared_ptr<fasttext::Matrix>::operator=
              ((shared_ptr<fasttext::Matrix> *)in_stack_fffffffffffffe90,
               (shared_ptr<fasttext::QuantMatrix> *)in_stack_fffffffffffffe88);
    std::shared_ptr<fasttext::QuantMatrix>::~shared_ptr
              ((shared_ptr<fasttext::QuantMatrix> *)0x1ac3de);
  }
  *(undefined1 *)(in_RDI + 0x68) = 1;
  createLoss(in_stack_ffffffffffffff68,(shared_ptr<fasttext::Matrix> *)in_stack_ffffffffffffff60);
  std::
  make_shared<fasttext::Model,std::shared_ptr<fasttext::Matrix>&,std::shared_ptr<fasttext::Matrix>&,std::shared_ptr<fasttext::Loss>&,bool&>
            ((shared_ptr<fasttext::Matrix> *)in_stack_fffffffffffffec8,
             (shared_ptr<fasttext::Matrix> *)in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,
             (bool *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
  std::shared_ptr<fasttext::Model>::operator=
            ((shared_ptr<fasttext::Model> *)in_stack_fffffffffffffe90,
             (shared_ptr<fasttext::Model> *)in_stack_fffffffffffffe88);
  std::shared_ptr<fasttext::Model>::~shared_ptr((shared_ptr<fasttext::Model> *)0x1ac458);
  std::shared_ptr<fasttext::Loss>::~shared_ptr((shared_ptr<fasttext::Loss> *)0x1ac465);
  std::shared_ptr<fasttext::DenseMatrix>::~shared_ptr((shared_ptr<fasttext::DenseMatrix> *)0x1ac472)
  ;
  std::shared_ptr<fasttext::DenseMatrix>::~shared_ptr((shared_ptr<fasttext::DenseMatrix> *)0x1ac47f)
  ;
  return;
}

Assistant:

void FastText::quantize(const Args& qargs) {
  if (args_->model != model_name::sup) {
    throw std::invalid_argument(
        "For now we only support quantization of supervised models");
  }
  args_->input = qargs.input;
  args_->qout = qargs.qout;
  args_->output = qargs.output;
  std::shared_ptr<DenseMatrix> input =
      std::dynamic_pointer_cast<DenseMatrix>(input_);
  std::shared_ptr<DenseMatrix> output =
      std::dynamic_pointer_cast<DenseMatrix>(output_);
  bool normalizeGradient = (args_->model == model_name::sup);

  if (qargs.cutoff > 0 && qargs.cutoff < input->size(0)) {
    auto idx = selectEmbeddings(qargs.cutoff);
    dict_->prune(idx);
    std::shared_ptr<DenseMatrix> ninput =
        std::make_shared<DenseMatrix>(idx.size(), args_->dim);
    for (auto i = 0; i < idx.size(); i++) {
      for (auto j = 0; j < args_->dim; j++) {
        ninput->at(i, j) = input->at(idx[i], j);
      }
    }
    input = ninput;
    if (qargs.retrain) {
      args_->epoch = qargs.epoch;
      args_->lr = qargs.lr;
      args_->thread = qargs.thread;
      args_->verbose = qargs.verbose;
      auto loss = createLoss(output_);
      model_ = std::make_shared<Model>(input, output, loss, normalizeGradient);
      startThreads();
    }
  }

  input_ = std::make_shared<QuantMatrix>(
      std::move(*(input.get())), qargs.dsub, qargs.qnorm);

  if (args_->qout) {
    output_ = std::make_shared<QuantMatrix>(
        std::move(*(output.get())), 2, qargs.qnorm);
  }

  quant_ = true;
  auto loss = createLoss(output_);
  model_ = std::make_shared<Model>(input_, output_, loss, normalizeGradient);
}